

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

vector<CSegment_*,_std::allocator<CSegment_*>_> * __thiscall
CWire::GetSegmentList(CWire *this,int iIndex)

{
  pointer pvVar1;
  
  if ((-1 < iIndex) &&
     (pvVar1 = (this->m_SegmentList).
               super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     iIndex < (int)((ulong)((long)(this->m_SegmentList).
                                  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >> 3) *
              -0x55555555)) {
    return pvVar1 + (uint)iIndex;
  }
  __assert_fail("iIndex>=0&&iIndex<GetNumSegmentList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x286,"vector<CSegment *> *CWire::GetSegmentList(int)");
}

Assistant:

vector<CSegment*>* CWire::GetSegmentList(int iIndex)
{
	assert(iIndex>=0&&iIndex<GetNumSegmentList());
	return	&m_SegmentList[iIndex];
}